

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O1

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::choose_leaf(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *this,indexable_type *entry)

{
  boundary_type *b;
  pointer prVar1;
  stored_size_type sVar2;
  ulong uVar3;
  type_conflict1 tVar4;
  type_conflict1 tVar5;
  ulong uVar6;
  size_t sVar7;
  node_type *node;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *in_R8;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  node_type n;
  double local_c0;
  ulong local_b8;
  node_type local_98;
  
  uVar6 = this->root_;
  if (uVar6 == 0xffffffffffffffff) {
    local_98.is_leaf = true;
    local_98.parent = 0xffffffffffffffff;
    local_98.entry.
    super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    .m_holder.m_size = 0;
    local_98.box.center.values_.elems[0] = (entry->center).values_.elems[0];
    local_98.box.center.values_.elems[1] = (entry->center).values_.elems[1];
    local_98.box.radius.values_.elems[0] = (entry->radius).values_.elems[0];
    local_98.box.radius.values_.elems[1] = (entry->radius).values_.elems[1];
    sVar7 = add_node(this,&local_98);
    this->root_ = sVar7;
    return sVar7;
  }
  if (uVar6 < (this->tree_).m_holder.m_size) {
    b = &this->boundary_;
    do {
      prVar1 = (this->tree_).m_holder.m_start;
      if (prVar1[uVar6].is_leaf != false) {
        return uVar6;
      }
      sVar2 = prVar1[uVar6].entry.
              super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              .m_holder.m_size;
      local_b8 = uVar6;
      if (sVar2 != 0) {
        lVar8 = 0;
        dVar12 = 1.79769313486232e+308;
        local_c0 = 1.79769313486232e+308;
        do {
          uVar3 = *(ulong *)((long)prVar1[uVar6].box.center.values_.elems + lVar8 + -0x38);
          if ((this->tree_).m_holder.m_size <= uVar3) goto LAB_0010871a;
          tVar4 = area<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                            (&(this->tree_).m_holder.m_start[uVar3].box,b);
          uVar3 = *(ulong *)((long)prVar1[uVar6].box.center.values_.elems + lVar8 + -0x38);
          if ((this->tree_).m_holder.m_size <= uVar3) goto LAB_0010871a;
          expand<perior::point<double,2ul>>
                    ((type *)&local_98,(perior *)&(this->tree_).m_holder.m_start[uVar3].box,entry,
                     (rectangle<perior::point<double,_2UL>_> *)b,in_R8);
          tVar5 = area<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                            ((rectangle<perior::point<double,_2UL>_> *)&local_98,b);
          uVar9 = SUB84(tVar5,0);
          uVar10 = (undefined4)((ulong)tVar5 >> 0x20);
          dVar11 = tVar5 - tVar4;
          if (dVar11 < dVar12) {
LAB_001086e2:
            local_b8 = *(ulong *)((long)prVar1[uVar6].box.center.values_.elems + lVar8 + -0x38);
            if (local_c0 <= tVar5) {
              uVar9 = SUB84(local_c0,0);
              uVar10 = (undefined4)((ulong)local_c0 >> 0x20);
            }
            local_c0 = (double)CONCAT44(uVar10,uVar9);
            dVar12 = dVar11;
          }
          else if (((dVar11 == dVar12) && (!NAN(dVar11) && !NAN(dVar12))) && (tVar5 < local_c0))
          goto LAB_001086e2;
          lVar8 = lVar8 + 8;
        } while (sVar2 << 3 != lVar8);
      }
      uVar6 = local_b8;
    } while (local_b8 < (this->tree_).m_holder.m_size);
  }
LAB_0010871a:
  boost::container::throw_out_of_range("vector::at out of range");
}

Assistant:

std::size_t choose_leaf(const indexable_type& entry)
    {
        if(this->root_ == nil)
        {
            node_type n(true, nil);
            n.box = make_aabb(entry);
            this->root_ = this->add_node(n);

            return this->root_;
        }

        // choose a leaf to insert
        // so if root is a leaf, return it
        std::size_t node_idx = this->root_;
        while(!(this->tree_.at(node_idx).is_leaf))
        {
            // find minimum expansion
            scalar_type diff_area_min = std::numeric_limits<scalar_type>::max();
            scalar_type area_min      = std::numeric_limits<scalar_type>::max();

            const node_type& node = this->tree_.at(node_idx);
            for(typename node_type::const_iterator
                    i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                const scalar_type area_initial
                    = area(this->tree_.at(*i).box, this->boundary_);

                const scalar_type area_expanded
                    = area(expand(this->tree_.at(*i).box, entry, this->boundary_),
                           this->boundary_);

                const scalar_type diff_area = area_expanded - area_initial;
                if((diff_area <  diff_area_min) ||
                   (diff_area == diff_area_min  && area_expanded < area_min))
                {
                    node_idx = *i;
                    diff_area_min = diff_area;
                    area_min      = std::min(area_min, area_expanded);
                }
            }
        }
        return node_idx;
    }